

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::SyncToSetAndBackupInst<false>::Print
          (SyncToSetAndBackupInst<false> *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x31);
  }
  DebugWriter::Print(w,L"SyncToSetAndBackup");
  DebugWriter::Print(w,L"(");
  SetMixin<false>::Print(&this->super_SetMixin<false>,w,litbuf);
  DebugWriter::Print(w,L", ");
  BackupMixin::Print(&this->super_BackupMixin,w,litbuf_00);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::BackupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BackupMixin,L"BackupMixin");
    DebugWriter::Unindent(w);
  }
  return 0x31;
}

Assistant:

int SyncToSetAndBackupInst<IsNegation>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (IsNegation)
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToNegatedSetAndBackup");
            PRINT_MIXIN_COMMA(SetMixin<true>);
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("SyncToSetAndBackup");
            PRINT_MIXIN_COMMA(SetMixin<false>);
        }

        PRINT_MIXIN(BackupMixin);
        PRINT_RE_BYTECODE_MID();
        IsNegation ? PRINT_BYTES(SetMixin<true>) : PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(BackupMixin);
        PRINT_RE_BYTECODE_END();
    }